

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiDriverInfo *info)

{
  long lVar1;
  Data *pDVar2;
  QDebug *pQVar3;
  QByteArray *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)info);
  *(undefined1 *)&(info->deviceName).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
       = 0;
  pQVar3 = QDebug::operator<<((QDebug *)info,"QRhiDriverInfo(deviceName=");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3," deviceId=0x");
  Qt::hex(&pQVar3->stream->ts);
  pQVar3 = QDebug::operator<<(pQVar3,(quint64)in_RDX[1].d.d);
  pQVar3 = QDebug::operator<<(pQVar3," vendorId=0x");
  pQVar3 = QDebug::operator<<(pQVar3,(quint64)in_RDX[1].d.ptr);
  pQVar3 = QDebug::operator<<(pQVar3," deviceType=");
  pQVar3 = QDebug::operator<<(pQVar3,&DAT_005f2638 +
                                     *(int *)(&DAT_005f2638 + (long)(int)in_RDX[1].d.size * 4));
  QDebug::operator<<(pQVar3,')');
  pDVar2 = (info->deviceName).d.d;
  (info->deviceName).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiDriverInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiDriverInfo(deviceName=" << info.deviceName
                  << " deviceId=0x" << Qt::hex << info.deviceId
                  << " vendorId=0x" << info.vendorId
                  << " deviceType=" << deviceTypeStr(info.deviceType)
                  << ')';
    return dbg;
}